

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32
laszip_has_spatial_index(laszip_POINTER pointer,laszip_BOOL *is_indexed,laszip_BOOL *is_appended)

{
  laszip_I32 lVar1;
  
  lVar1 = 1;
  if (pointer != (laszip_POINTER)0x0) {
    if (is_indexed == (laszip_BOOL *)0x0) {
      builtin_strncpy((char *)((long)pointer + 0x261),"ndexed\' ",8);
      builtin_strncpy((char *)((long)pointer + 0x269),"is zero",8);
      builtin_strncpy((char *)((long)pointer + 600),"ter \'is_",8);
      builtin_strncpy((char *)((long)pointer + 0x260),"indexed\'",8);
      builtin_strncpy((char *)((long)pointer + 0x248),"laszip_B",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"OOL poin",8);
    }
    else if (*(long *)((long)pointer + 0x228) == 0) {
      builtin_strncpy((char *)((long)pointer + 0x248),"reader i",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"s not op",8);
      *(undefined4 *)((long)pointer + 599) = 0x6e6570;
    }
    else if (*(long *)((long)pointer + 0x238) == 0) {
      if (*(char *)((long)pointer + 0xa7a) == '\0') {
        memcpy((void *)((long)pointer + 0x248),
               "exploiting of spatial indexing not enabled before opening reader",0x41);
      }
      else {
        *is_indexed = (uint)(*(long *)((long)pointer + 0xa48) != 0);
        if (is_appended != (laszip_BOOL *)0x0) {
          *is_appended = 0;
        }
        *(undefined1 *)((long)pointer + 0x248) = 0;
        lVar1 = 0;
      }
    }
    else {
      builtin_strncpy((char *)((long)pointer + 0x248),"writer i",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"s alread",8);
      *(undefined8 *)((long)pointer + 599) = 0x6e65706f207964;
    }
  }
  return lVar1;
}

Assistant:

LASZIP_API laszip_I32
laszip_has_spatial_index(
    laszip_POINTER                     pointer
    , laszip_BOOL*                     is_indexed
    , laszip_BOOL*                     is_appended
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (is_indexed == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_BOOL pointer 'is_indexed' is zero");
      return 1;
    }

    if (laszip_dll->reader == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is not open");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    if (laszip_dll->lax_exploit == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "exploiting of spatial indexing not enabled before opening reader");
      return 1;
    }

    // check if reader found spatial indexing information when opening file

    if (laszip_dll->lax_index)
    {
      *is_indexed = 1;
    }
    else
    {
      *is_indexed = 0;
    }

    // optional: inform whether spatial index is appended to LAZ file or in separate LAX file

    if (is_appended)
    {
      *is_appended = 0;
    }

  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_have_spatial_index");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}